

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs8_x509.cc
# Opt level: O3

int i2d_PKCS12(PKCS12 *a,uchar **out)

{
  PKCS12_MAC_DATA *size;
  uchar *puVar1;
  
  size = a->mac;
  if (((ulong)size & 0xffffffff80000000) == 0) {
    if (out == (uchar **)0x0) goto LAB_0047ab82;
    puVar1 = *out;
    if (puVar1 != (uchar *)0x0) {
      if (size == (PKCS12_MAC_DATA *)0x0) {
        size = (PKCS12_MAC_DATA *)0x0;
      }
      else {
        memcpy(puVar1,a->version,(size_t)size);
        size = a->mac;
        puVar1 = *out;
      }
      *out = puVar1 + (long)size;
      goto LAB_0047ab82;
    }
    puVar1 = (uchar *)OPENSSL_memdup(a->version,(size_t)size);
    *out = puVar1;
    if (puVar1 != (uchar *)0x0) {
      size = a->mac;
      goto LAB_0047ab82;
    }
  }
  else {
    ERR_put_error(0x13,0,0x45,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs8_x509.cc"
                  ,0x313);
  }
  size = (PKCS12_MAC_DATA *)&DAT_ffffffff;
LAB_0047ab82:
  return (int)size;
}

Assistant:

int i2d_PKCS12(const PKCS12 *p12, uint8_t **out) {
  if (p12->ber_len > INT_MAX) {
    OPENSSL_PUT_ERROR(PKCS8, ERR_R_OVERFLOW);
    return -1;
  }

  if (out == NULL) {
    return (int)p12->ber_len;
  }

  if (*out == NULL) {
    *out = reinterpret_cast<uint8_t *>(
        OPENSSL_memdup(p12->ber_bytes, p12->ber_len));
    if (*out == NULL) {
      return -1;
    }
  } else {
    OPENSSL_memcpy(*out, p12->ber_bytes, p12->ber_len);
    *out += p12->ber_len;
  }
  return (int)p12->ber_len;
}